

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int i;
  long lVar3;
  bool bVar4;
  visualOutput *local_570;
  vector<int,_std::allocator<int>_> inNums;
  vector<int,_std::allocator<int>_> outNums;
  _Vector_base<int,_std::allocator<int>_> local_530;
  _Vector_base<int,_std::allocator<int>_> local_518;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  consoleInput cIn;
  visualOutput vOu;
  consoleOutput cOut;
  listInput lIn;
  listOutput lOut;
  ifstream file;
  
  std::ifstream::ifstream(&file);
  signal(0x1c,redrawSystem);
  if (1 < argc) {
    std::ifstream::open((char *)&file,(_Ios_Openmode)argv[1]);
  }
  setlocale(6,"");
  initscr();
  start_color();
  noecho();
  cbreak();
  mousemask(0xfffffff,0);
  keypad(_stdscr,1);
  init_pair(1,0,7);
  init_pair(2,0,2);
  init_pair(3,0,1);
  init_pair(4,0,3);
  init_pair(5,7,0);
  init_color(8,0xfa,0xfa,0xfa);
  init_color(9,500,500,500);
  init_pair(6,7,0);
  init_pair(7,7,8);
  init_pair(8,7,9);
  init_pair(9,7);
  init_pair(10,7,1);
  setCursor(false);
  refresh();
  initSystem(2,2);
  inNums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  inNums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  inNums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  iVar2 = 0x14;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    iVar1 = rand();
    cIn.super_input._vptr_input =
         (_func_int **)CONCAT44(cIn.super_input._vptr_input._4_4_,iVar1 % 500 + 100);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&inNums,(int *)&cIn);
  }
  std::__cxx11::string::string((string *)&local_480,"IN.A",(allocator *)&cIn);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_518,&inNums);
  listInput::listInput(&lIn,0x80,1,&local_480,0x14,(vector<int,_std::allocator<int>_> *)&local_518);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_518);
  std::__cxx11::string::~string((string *)&local_480);
  listInput::initArrow(&lIn,'\0','\0');
  cIn.super_input._vptr_input = (_func_int **)&lIn;
  std::vector<input*,std::allocator<input*>>::emplace_back<input*>
            ((vector<input*,std::allocator<input*>> *)&inputs,(input **)&cIn);
  outNums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  outNums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  outNums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  for (lVar3 = 0; lVar3 != 0x14; lVar3 = lVar3 + 1) {
    cIn.super_input._vptr_input =
         (_func_int **)
         CONCAT44(cIn.super_input._vptr_input._4_4_,
                  inNums.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar3] % 10);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&outNums,(int *)&cIn);
  }
  std::__cxx11::string::string((string *)&local_4a0,"OU.A",(allocator *)&cIn);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_530,&outNums);
  listOutput::listOutput
            (&lOut,0x80,0x19,&local_4a0,0x14,(vector<int,_std::allocator<int>_> *)&local_530);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_530);
  std::__cxx11::string::~string((string *)&local_4a0);
  listOutput::initArrow(&lOut,'\x0f','\x02');
  cIn.super_input._vptr_input = (_func_int **)&lOut;
  std::vector<output*,std::allocator<output*>>::emplace_back<output*>
            ((vector<output*,std::allocator<output*>> *)&outputs,(output **)&cIn);
  std::__cxx11::string::string((string *)&local_4c0,"OU.B",(allocator *)&cIn);
  consoleOutput::consoleOutput(&cOut,0x91,0x19,&local_4c0,0x14);
  std::__cxx11::string::~string((string *)&local_4c0);
  consoleOutput::initArrow(&cOut,'\x0e','\x02');
  cIn.super_input._vptr_input = (_func_int **)&cOut;
  std::vector<output*,std::allocator<output*>>::emplace_back<output*>
            ((vector<output*,std::allocator<output*>> *)&outputs,(output **)&cIn);
  std::__cxx11::string::string((string *)&local_4e0,"IN.B",(allocator *)&vOu);
  consoleInput::consoleInput(&cIn,0x91,1,&local_4e0,0x12);
  std::__cxx11::string::~string((string *)&local_4e0);
  consoleInput::initArrow(&cIn,'\x01','\0');
  vOu.super_output._vptr_output = (_func_int **)&cIn;
  std::vector<input*,std::allocator<input*>>::emplace_back<input*>
            ((vector<input*,std::allocator<input*>> *)&inputs,(input **)&vOu);
  vOu.super_output._vptr_output = (_func_int **)&cIn.super_runtimeInput;
  std::vector<runtimeInput*,std::allocator<runtimeInput*>>::emplace_back<runtimeInput*>
            ((vector<runtimeInput*,std::allocator<runtimeInput*>> *)&runtimeInputs,
             (runtimeInput **)&vOu);
  std::__cxx11::string::string((string *)&local_500,"OU.C",(allocator *)&local_570);
  visualOutput::visualOutput(&vOu,0x9b,0x19,&local_500,0x24,0x16);
  std::__cxx11::string::~string((string *)&local_500);
  visualOutput::initArrow(&vOu,'\r','\x02');
  local_570 = &vOu;
  std::vector<output*,std::allocator<output*>>::emplace_back<output*>
            ((vector<output*,std::allocator<output*>> *)&outputs,(output **)&local_570);
  state = 1;
  endwin();
  while( true ) {
    while( true ) {
      while (state == 1) {
        drawSystemContent();
        editLoop();
      }
      if (state != 2) break;
      runtimeLoop();
    }
    if (state == 0) break;
    state = 1;
  }
  endwin();
  visualOutput::~visualOutput(&vOu);
  consoleInput::~consoleInput(&cIn);
  output::~output(&cOut.super_output);
  listOutput::~listOutput(&lOut);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&outNums.super__Vector_base<int,_std::allocator<int>_>);
  listInput::~listInput(&lIn);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&inNums.super__Vector_base<int,_std::allocator<int>_>);
  std::ifstream::~ifstream(&file);
  return 0;
}

Assistant:

int main(int argc, char *argv[]){
  std::ifstream file;

  
  signal(SIGWINCH, redrawSystem);

  if(argc>=2)
    file.open(argv[1]);
  
  setlocale(LC_ALL, "");
  initscr();
  start_color();
  
  noecho();
  cbreak();
  mousemask(ALL_MOUSE_EVENTS, NULL);
	keypad(stdscr, TRUE);

  init_pair(1, COLOR_BLACK, COLOR_WHITE);
  init_pair(2, COLOR_BLACK, COLOR_GREEN);
  init_pair(3, COLOR_BLACK, COLOR_RED);
  init_pair(4, COLOR_BLACK, COLOR_YELLOW);
  init_pair(5, COLOR_WHITE, COLOR_BLACK);

  init_color(COLOR_DARK_GREY, 250, 250, 250);
  init_color(COLOR_BRIGHT_GREY, 500, 500, 500);

  init_pair(6, COLOR_WHITE, COLOR_BLACK);
  init_pair(7, COLOR_WHITE, COLOR_DARK_GREY);
  init_pair(8, COLOR_WHITE, COLOR_BRIGHT_GREY);
  init_pair(9, COLOR_WHITE, COLOR_WHITE);
  init_pair(10, COLOR_WHITE, COLOR_RED);

  setCursor(false);

  refresh();

  initSystem(2, 2);
  
  
  // TEST INPUTS AND OUTPUTS
  
  vector<int> inNums;
  for (int i = 0; i < 20; i++) {
    inNums.push_back((rand() % 500) + 100);
  }
	
  listInput lIn = listInput(128, 1, "IN.A", 20, inNums);
  lIn.initArrow(0, 0);
  inputs.push_back(&lIn);
  
  vector<int> outNums;
  for (int i = 0; i < 20; i++) {
    outNums.push_back(inNums[i] % 10);
  }
  
  listOutput lOut = listOutput(128, 25, "OU.A", 20, outNums);
  lOut.initArrow(15, 2);
  outputs.push_back(&lOut);
  
  consoleOutput cOut = consoleOutput(145, 25, "OU.B", 20);
  cOut.initArrow(14, 2);
  outputs.push_back(&cOut);
  
  consoleInput cIn = consoleInput(145, 1, "IN.B", 18);
  cIn.initArrow(1, 0);
  inputs.push_back(&cIn);
  runtimeInputs.push_back(&cIn);

  visualOutput vOu = visualOutput(155, 25, "OU.C", 36, 22);
  vOu.initArrow(13, 2);
  outputs.push_back(&vOu);
	  
  state = EDIT;

  endwin();
  while (state != OFF) {
  	switch(state) {
  		case EDIT:
  			redrawContent();
  			editLoop();
  			break;
  		case RUNNING:
  			runtimeLoop();
  			break;
  		default:
  			state = EDIT;
  	}
  }

  endwin();
  return 0;
}